

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrMesh.cpp
# Opt level: O0

ostream * amrex::operator<<(ostream *os,AmrMesh *amr_mesh)

{
  ostream *poVar1;
  long in_RSI;
  ostream *in_RDI;
  int lev_3;
  int lev_2;
  int lev_1;
  int lev;
  ostream *in_stack_ffffffffffffffb8;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *in_stack_ffffffffffffffc0;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  
  poVar1 = std::operator<<(in_RDI,"  verbose = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RSI + 8));
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(in_RDI,"  max_level = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RSI + 0xc));
  std::operator<<(poVar1,"\n");
  std::operator<<(in_RDI,"  ref_ratio =");
  for (local_14 = 0; local_14 < *(int *)(in_RSI + 0xc); local_14 = local_14 + 1) {
    std::operator<<(in_RDI," ");
    Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
              (in_stack_ffffffffffffffc0,(size_type)in_stack_ffffffffffffffb8);
    operator<<(in_stack_ffffffffffffffb8,(IntVect *)0x137a54f);
  }
  std::operator<<(in_RDI,"\n");
  std::operator<<(in_RDI,"  blocking_factor =");
  for (local_18 = 0; local_18 <= *(int *)(in_RSI + 0xc); local_18 = local_18 + 1) {
    std::operator<<(in_RDI," ");
    Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
              (in_stack_ffffffffffffffc0,(size_type)in_stack_ffffffffffffffb8);
    operator<<(in_stack_ffffffffffffffb8,(IntVect *)0x137a5ce);
  }
  std::operator<<(in_RDI,"\n");
  std::operator<<(in_RDI,"  max_grid_size =");
  for (local_1c = 0; local_1c <= *(int *)(in_RSI + 0xc); local_1c = local_1c + 1) {
    std::operator<<(in_RDI," ");
    Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
              (in_stack_ffffffffffffffc0,(size_type)in_stack_ffffffffffffffb8);
    operator<<(in_stack_ffffffffffffffb8,(IntVect *)0x137a64d);
  }
  std::operator<<(in_RDI,"\n");
  std::operator<<(in_RDI,"  n_error_buf =");
  for (local_20 = 0; local_20 < *(int *)(in_RSI + 0xc); local_20 = local_20 + 1) {
    poVar1 = std::operator<<(in_RDI," ");
    Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
              ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)poVar1,
               (size_type)in_stack_ffffffffffffffb8);
    operator<<(in_stack_ffffffffffffffb8,(IntVect *)0x137a6cc);
  }
  std::operator<<(in_RDI,"\n");
  poVar1 = std::operator<<(in_RDI,"  grid_eff = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(double *)(in_RSI + 0x70));
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(in_RDI,"  n_proper = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RSI + 0x78));
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(in_RDI,"  use_fixed_upto_level = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RSI + 0x7c));
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(in_RDI,"  use_fixed_coarse_grids = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(bool)(*(byte *)(in_RSI + 0x80) & 1));
  std::operator<<(poVar1,"\n");
  std::operator<<(in_RDI,"  refine_grid_layout_dims = ");
  poVar1 = operator<<(in_stack_ffffffffffffffb8,(IntVect *)0x137a7da);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(in_RDI,"  check_input = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(bool)(*(byte *)(in_RSI + 0x90) & 1));
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(in_RDI,"  use_new_chop = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(bool)(*(byte *)(in_RSI + 0x91) & 1));
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(in_RDI,"  iterate_on_new_grids = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(bool)(*(byte *)(in_RSI + 0x92) & 1));
  std::operator<<(poVar1,"\n");
  return in_RDI;
}

Assistant:

std::ostream& operator<< (std::ostream& os, AmrMesh const& amr_mesh)
{
    os << "  verbose = " << amr_mesh.verbose << "\n";
    os << "  max_level = " << amr_mesh.max_level << "\n";
    os << "  ref_ratio =";
    for (int lev = 0; lev < amr_mesh.max_level; ++lev) os << " " << amr_mesh.ref_ratio[lev];
    os << "\n";
    os << "  blocking_factor =";
    for (int lev = 0; lev <= amr_mesh.max_level; ++lev) os << " " << amr_mesh.blocking_factor[lev];
    os << "\n";
    os << "  max_grid_size =";
    for (int lev = 0; lev <= amr_mesh.max_level; ++lev) os << " " << amr_mesh.max_grid_size[lev];
    os << "\n";
    os << "  n_error_buf =";
    for (int lev = 0; lev < amr_mesh.max_level; ++lev) os << " " << amr_mesh.n_error_buf[lev];
    os << "\n";
    os << "  grid_eff = " << amr_mesh.grid_eff << "\n";
    os << "  n_proper = " << amr_mesh.n_proper << "\n";
    os << "  use_fixed_upto_level = " << amr_mesh.use_fixed_upto_level << "\n";
    os << "  use_fixed_coarse_grids = " << amr_mesh.use_fixed_coarse_grids << "\n";
    os << "  refine_grid_layout_dims = " << amr_mesh.refine_grid_layout_dims << "\n";
    os << "  check_input = " << amr_mesh.check_input  << "\n";
    os << "  use_new_chop = " << amr_mesh.use_new_chop << "\n";
    os << "  iterate_on_new_grids = " << amr_mesh.iterate_on_new_grids << "\n";
    return os;
}